

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

int test_connect_impl(char *file,int line,int sock,char *address)

{
  FILE *__stream;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  undefined4 in_register_00000014;
  
  iVar1 = nn_connect(line,"inproc://pair",CONCAT44(in_register_00000014,sock));
  __stream = _stderr;
  if (-1 < iVar1) {
    return iVar1;
  }
  puVar2 = (uint *)__errno_location();
  pcVar3 = nn_err_strerror(*puVar2);
  fprintf(__stream,"Failed connect to \"%s\": %s [%d] (%s:%d)\n","inproc://pair",pcVar3,
          (ulong)*puVar2,
          "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/bug777.c",
          (int)file);
  nn_err_abort();
}

Assistant:

static int NN_UNUSED test_connect_impl (char *file, int line,
    int sock, char *address)
{
    int rc;

    rc = nn_connect (sock, address);
    if(rc < 0) {
        fprintf (stderr, "Failed connect to \"%s\": %s [%d] (%s:%d)\n",
            address,
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }
    return rc;
}